

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::Clipper::AddEdgeToSEL(Clipper *this,TEdge *edge)

{
  if (this->m_SortedEdges != (TEdge *)0x0) {
    edge->nextInSEL = this->m_SortedEdges;
    edge->prevInSEL = (TEdge *)0x0;
    this->m_SortedEdges->prevInSEL = edge;
    this->m_SortedEdges = edge;
    return;
  }
  this->m_SortedEdges = edge;
  edge->nextInSEL = (TEdge *)0x0;
  edge->prevInSEL = (TEdge *)0x0;
  return;
}

Assistant:

void Clipper::AddEdgeToSEL(TEdge *edge)
{
  //SEL pointers in PEdge are reused to build a list of horizontal edges.
  //However, we don't need to worry about order with horizontal edge processing.
  if( !m_SortedEdges )
  {
    m_SortedEdges = edge;
    edge->prevInSEL = 0;
    edge->nextInSEL = 0;
  }
  else
  {
    edge->nextInSEL = m_SortedEdges;
    edge->prevInSEL = 0;
    m_SortedEdges->prevInSEL = edge;
    m_SortedEdges = edge;
  }
}